

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttmtx.c
# Opt level: O3

void tt_face_get_metrics(TT_Face face,FT_Bool vertical,FT_UInt gindex,FT_Short *abearing,
                        FT_UShort *aadvance)

{
  ushort uVar1;
  undefined8 *puVar2;
  FT_Stream pFVar3;
  FT_UInt16 FVar4;
  TT_VertHeader *pTVar5;
  ulong uVar6;
  code *pcVar7;
  ulong uVar8;
  undefined7 in_register_00000031;
  FT_ULong FVar9;
  bool bVar10;
  FT_Error error;
  FT_Int a;
  FT_Int b;
  int local_54;
  uint local_50;
  int local_4c;
  ushort *local_48;
  FT_UInt16 *local_40;
  FT_Stream local_38;
  
  puVar2 = (undefined8 *)face->var;
  bVar10 = (int)CONCAT71(in_register_00000031,vertical) != 0;
  pTVar5 = &face->vertical;
  if (!bVar10) {
    pTVar5 = (TT_VertHeader *)&face->horizontal;
  }
  uVar1 = pTVar5->number_Of_VMetrics;
  if (uVar1 != 0) {
    pFVar3 = (face->root).stream;
    FVar9 = (&face->horz_metrics_offset)[bVar10];
    uVar8 = (&face->horz_metrics_size)[bVar10] + FVar9;
    if (gindex < uVar1) {
      if (((ulong)gindex * 4 + 4 + FVar9 <= uVar8) &&
         (local_54 = FT_Stream_Seek(pFVar3,(ulong)gindex * 4 + FVar9), local_54 == 0)) {
        FVar4 = FT_Stream_ReadUShort(pFVar3,&local_54);
        *aadvance = FVar4;
        if (local_54 == 0) {
          FVar4 = FT_Stream_ReadUShort(pFVar3,&local_54);
          *abearing = FVar4;
          if (local_54 == 0) goto LAB_00247a86;
        }
      }
    }
    else {
      uVar6 = (ulong)((uint)uVar1 * 4 - 4);
      if (uVar6 + FVar9 + 2 <= uVar8) {
        FVar9 = FVar9 + uVar6;
        local_48 = aadvance;
        local_40 = (FT_UInt16 *)abearing;
        local_38 = pFVar3;
        local_54 = FT_Stream_Seek(pFVar3,FVar9);
        abearing = (FT_Short *)local_40;
        aadvance = local_48;
        if (local_54 == 0) {
          FVar4 = FT_Stream_ReadUShort(local_38,&local_54);
          pFVar3 = local_38;
          *local_48 = FVar4;
          abearing = (FT_Short *)local_40;
          aadvance = local_48;
          if (local_54 == 0) {
            uVar6 = (ulong)((gindex - uVar1) * 2 + 4);
            if (uVar8 < uVar6 + FVar9 + 2) {
              *local_40 = 0;
            }
            else {
              local_54 = FT_Stream_Seek(local_38,FVar9 + uVar6);
              if (local_54 == 0) {
                FVar4 = FT_Stream_ReadUShort(pFVar3,&local_54);
                *local_40 = FVar4;
                abearing = (FT_Short *)local_40;
                aadvance = local_48;
              }
              else {
                *local_40 = 0;
                abearing = (FT_Short *)local_40;
                aadvance = local_48;
              }
            }
            goto LAB_00247a86;
          }
        }
      }
    }
  }
  *abearing = 0;
  *aadvance = 0;
LAB_00247a86:
  if ((puVar2 != (undefined8 *)0x0) && (face->blend != (GX_Blend)0x0)) {
    local_50 = (uint)*aadvance;
    local_4c = (int)*abearing;
    if (vertical == '\0') {
      if ((code *)*puVar2 != (code *)0x0) {
        (*(code *)*puVar2)(face,gindex,&local_50);
      }
      pcVar7 = (code *)puVar2[1];
    }
    else {
      if ((code *)puVar2[3] != (code *)0x0) {
        (*(code *)puVar2[3])(face,gindex,&local_50);
      }
      pcVar7 = (code *)puVar2[4];
    }
    if (pcVar7 != (code *)0x0) {
      (*pcVar7)(face,gindex,&local_4c);
    }
    *aadvance = (ushort)local_50;
    *abearing = (FT_UInt16)local_4c;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  tt_face_get_metrics( TT_Face     face,
                       FT_Bool     vertical,
                       FT_UInt     gindex,
                       FT_Short   *abearing,
                       FT_UShort  *aadvance )
  {
    FT_Error        error;
    FT_Stream       stream = face->root.stream;
    TT_HoriHeader*  header;
    FT_ULong        table_pos, table_size, table_end;
    FT_UShort       k;

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    FT_Service_MetricsVariations  var =
      (FT_Service_MetricsVariations)face->var;
#endif


    if ( vertical )
    {
      void*  v = &face->vertical;


      header     = (TT_HoriHeader*)v;
      table_pos  = face->vert_metrics_offset;
      table_size = face->vert_metrics_size;
    }
    else
    {
      header     = &face->horizontal;
      table_pos  = face->horz_metrics_offset;
      table_size = face->horz_metrics_size;
    }

    table_end = table_pos + table_size;

    k = header->number_Of_HMetrics;

    if ( k > 0 )
    {
      if ( gindex < (FT_UInt)k )
      {
        table_pos += 4 * gindex;
        if ( table_pos + 4 > table_end )
          goto NoData;

        if ( FT_STREAM_SEEK( table_pos ) ||
             FT_READ_USHORT( *aadvance ) ||
             FT_READ_SHORT( *abearing )  )
          goto NoData;
      }
      else
      {
        table_pos += 4 * ( k - 1 );
        if ( table_pos + 2 > table_end )
          goto NoData;

        if ( FT_STREAM_SEEK( table_pos ) ||
             FT_READ_USHORT( *aadvance ) )
          goto NoData;

        table_pos += 4 + 2 * ( gindex - k );
        if ( table_pos + 2 > table_end )
          *abearing = 0;
        else
        {
          if ( FT_STREAM_SEEK( table_pos ) )
            *abearing = 0;
          else
            (void)FT_READ_SHORT( *abearing );
        }
      }
    }
    else
    {
    NoData:
      *abearing = 0;
      *aadvance = 0;
    }

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    if ( var && face->blend )
    {
      FT_Face  f = FT_FACE( face );
      FT_Int   a = (FT_Int)*aadvance;
      FT_Int   b = (FT_Int)*abearing;


      if ( vertical )
      {
        if ( var->vadvance_adjust )
          var->vadvance_adjust( f, gindex, &a );
        if ( var->tsb_adjust )
          var->tsb_adjust( f, gindex, &b );
      }
      else
      {
        if ( var->hadvance_adjust )
          var->hadvance_adjust( f, gindex, &a );
        if ( var->lsb_adjust )
          var->lsb_adjust( f, gindex, &b );
      }

      *aadvance = (FT_UShort)a;
      *abearing = (FT_Short)b;
    }
#endif
  }